

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O3

int64_t getLastPCR(File *file,int bufferSize,int64_t fileSize)

{
  void *pvVar1;
  ulong uVar2;
  byte *pbVar3;
  size_t in_RCX;
  byte *pbVar4;
  long lVar5;
  ulong uVar6;
  
  lVar5 = fileSize - bufferSize;
  if (lVar5 < 1) {
    lVar5 = 0;
  }
  File::seek(file,lVar5,smBegin);
  pvVar1 = operator_new__((long)bufferSize);
  uVar2 = File::read(file,(int)pvVar1,(void *)(ulong)(uint)bufferSize,in_RCX);
  if ((int)(uint)uVar2 < 1) {
    uVar6 = 0xfffffffffffffffe;
  }
  else {
    uVar6 = 0xffffffffffffffff;
    if (2 < (uint)uVar2) {
      pbVar3 = (byte *)((uVar2 & 0xffffffff) + (long)pvVar1);
      pbVar4 = (byte *)((long)pvVar1 + 2);
      do {
        lVar5 = 3;
        if (*pbVar4 < 2) {
          if (*pbVar4 == 0) {
            lVar5 = 1;
          }
          else if ((pbVar4[-2] == 0) && (pbVar4[-1] == 0)) {
            pbVar4 = pbVar4 + -2;
            if (pbVar4 <= pbVar3 + -0x11) {
              uVar6 = 0xffffffffffffffff;
              goto LAB_001c6ce4;
            }
            break;
          }
        }
        pbVar4 = pbVar4 + lVar5;
      } while (pbVar4 < pbVar3);
    }
LAB_001c6cb6:
    operator_delete__(pvVar1);
  }
  return uVar6;
LAB_001c6ce4:
  if (((byte)(pbVar4[3] + 0x41) < 0x31 || (pbVar4[3] & 0xbf) == 0xbd) && ((char)pbVar4[7] < '\0')) {
    uVar6 = (ulong)((ushort)(*(ushort *)(pbVar4 + 0xc) << 8 | *(ushort *)(pbVar4 + 0xc) >> 8) >> 1)
            | (ulong)((pbVar4[0xb] & 0xfe) << 0xe | (uint)pbVar4[10] << 0x16) |
              (ulong)(pbVar4[9] >> 1 & 7) << 0x1e;
  }
  pbVar4 = pbVar4 + 6;
  do {
    lVar5 = 3;
    if (*pbVar4 < 2) {
      if (*pbVar4 == 0) {
        lVar5 = 1;
      }
      else if ((pbVar4[-2] == 0) && (pbVar4[-1] == 0)) break;
    }
    pbVar4 = pbVar4 + lVar5;
    if (pbVar3 <= pbVar4) goto LAB_001c6cb6;
  } while( true );
  pbVar4 = pbVar4 + -2;
  if (pbVar3 + -0x11 < pbVar4) goto LAB_001c6cb6;
  goto LAB_001c6ce4;
}

Assistant:

int64_t getLastPCR(const File& file, const int bufferSize, const int64_t fileSize)
{
    file.seek(FFMAX(0, fileSize - bufferSize), File::SeekMethod::smBegin);
    const auto tmpBuffer = new uint8_t[bufferSize];
    const int len = file.read(tmpBuffer, bufferSize);
    if (len < 1)
        return -2;
    uint8_t* curPtr = tmpBuffer;
    uint8_t* bufEnd = tmpBuffer + len;
    int64_t lastPcrVal = -1;

    curPtr = MPEGHeader::findNextMarker(curPtr, bufEnd);
    while (curPtr <= bufEnd - 9 - 8)
    {
        const auto pesPacket = reinterpret_cast<PESPacket*>(curPtr);
        const uint8_t startcode = curPtr[3];
        if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) || (startcode == PES_VC1_ID) ||
            (startcode == PES_PRIVATE_DATA2))
        {
            if ((pesPacket->flagsLo & 0x80) == 0x80)
                lastPcrVal = pesPacket->getPts();
        }
        curPtr = MPEGHeader::findNextMarker(curPtr + 4, bufEnd);
    }
    delete[] tmpBuffer;
    return lastPcrVal;
}